

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 extraout_var;
  reference pptVar6;
  string_t *what;
  parser_info_t<cfgfile::qstring_trait_t> *in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  QString *in_stack_fffffffffffff928;
  qstring_wrapper_t *in_stack_fffffffffffff930;
  string_t *in_stack_fffffffffffff938;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffff940;
  exception_t<cfgfile::qstring_trait_t> *this_01;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffff948;
  allocator<char> *in_stack_fffffffffffff960;
  allocator<char> *__a;
  string *in_stack_fffffffffffff968;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  exception_t<cfgfile::qstring_trait_t> local_591 [9];
  tag_t<cfgfile::qstring_trait_t> *local_418;
  tag_t<cfgfile::qstring_trait_t> **local_410;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_408;
  undefined8 local_400;
  undefined1 local_3f2;
  allocator<char> local_3f1 [88];
  string local_399 [10];
  undefined1 local_24a;
  parser_info_t<cfgfile::qstring_trait_t> *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI[1].m_name.m_str.d.size != 0) &&
     (plVar1 = (long *)in_RDI[1].m_name.m_str.d.size,
     uVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RDI + 1), (uVar4 & 1) == 0)) {
    local_24a = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    qstring_wrapper_t::qstring_wrapper_t(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
    qstring_trait_t::to_string((pos_t)in_stack_fffffffffffff968);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    exception_t<cfgfile::qstring_trait_t>::exception_t
              (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    local_24a = 0;
    __cxa_throw(uVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  bVar2 = tag_t<cfgfile::qstring_trait_t>::is_defined_member_value(in_RDI);
  if (!bVar2) {
    local_3f2 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
              (qstring_wrapper_t *)in_stack_fffffffffffff960);
    str = local_399;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)str,in_stack_fffffffffffff960);
    qstring_trait_t::from_ascii(str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)in_stack_fffffffffffff960);
    parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
    qstring_trait_t::to_string((pos_t)str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)in_stack_fffffffffffff960);
    __a = local_3f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)str,__a);
    qstring_trait_t::from_ascii(str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
    exception_t<cfgfile::qstring_trait_t>::exception_t
              (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    local_3f2 = 0;
    __cxa_throw(uVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  iVar3 = (*in_RDI->_vptr_tag_t[2])();
  local_400 = CONCAT44(extraout_var,iVar3);
  local_408._M_current =
       (tag_t<cfgfile::qstring_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
       ::begin((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                *)in_stack_fffffffffffff928);
  local_410 = (tag_t<cfgfile::qstring_trait_t> **)
              std::
              vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ::end((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                     *)in_stack_fffffffffffff928);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                        *)in_stack_fffffffffffff930,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                        *)in_stack_fffffffffffff928);
    if (!bVar2) {
      return;
    }
    pptVar6 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
              ::operator*(&local_408);
    local_418 = *pptVar6;
    bVar2 = tag_t<cfgfile::qstring_trait_t>::is_mandatory(local_418);
    if ((bVar2) &&
       (bVar2 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_stack_fffffffffffff948), !bVar2))
    break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
    ::operator++(&local_408);
  }
  uVar5 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
  tag_t<cfgfile::qstring_trait_t>::name(local_418);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  this_01 = local_591;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  what = parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
  qstring_trait_t::to_string((pos_t)in_stack_fffffffffffff968);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  qstring_trait_t::from_ascii(in_stack_fffffffffffff968);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffff968,
            (qstring_wrapper_t *)in_stack_fffffffffffff960);
  exception_t<cfgfile::qstring_trait_t>::exception_t(this_01,what);
  __cxa_throw(uVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t( m_value ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}